

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

void __thiscall
Diligent::InputLayoutDescX::InputLayoutDescX(InputLayoutDescX *this,InputLayoutDesc *_Desc)

{
  LayoutElement *__first;
  undefined4 uVar1;
  InputLayoutDesc *_Desc_local;
  InputLayoutDescX *this_local;
  
  (this->Desc).LayoutElements = _Desc->LayoutElements;
  uVar1 = *(undefined4 *)&_Desc->field_0xc;
  (this->Desc).NumElements = _Desc->NumElements;
  *(undefined4 *)&(this->Desc).field_0xc = uVar1;
  std::vector<Diligent::LayoutElement,_std::allocator<Diligent::LayoutElement>_>::vector
            (&this->Elements);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->StringPool);
  if ((this->Desc).NumElements != 0) {
    __first = (this->Desc).LayoutElements;
    std::vector<Diligent::LayoutElement,std::allocator<Diligent::LayoutElement>>::
    assign<Diligent::LayoutElement_const*,void>
              ((vector<Diligent::LayoutElement,std::allocator<Diligent::LayoutElement>> *)
               &this->Elements,__first,__first + (this->Desc).NumElements);
  }
  SyncDesc(this,true);
  return;
}

Assistant:

InputLayoutDescX(const InputLayoutDesc& _Desc) :
        Desc{_Desc}
    {
        if (Desc.NumElements != 0)
            Elements.assign(Desc.LayoutElements, Desc.LayoutElements + Desc.NumElements);

        SyncDesc(true);
    }